

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O3

void __thiscall CTB<RemSP>::PerformLabeling(CTB<RemSP> *this)

{
  long lVar1;
  int *piVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint j;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined4 uVar22;
  int iVar23;
  long lVar24;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  puVar7 = (uint *)operator_new__((ulong)((((int)((ulong)*(undefined8 *)&pMVar3->field_0x8 >> 0x20)
                                           + 1) / 2) *
                                          (((int)*(undefined8 *)&pMVar3->field_0x8 + 1) / 2) + 1) <<
                                  2);
  RemSP::P_ = puVar7;
  *puVar7 = 0;
  RemSP::length_ = 1;
  iVar18 = *(int *)&pMVar3->field_0x8;
  uVar19 = (ulong)iVar18;
  uVar14 = 1;
  if (0 < (long)uVar19) {
    uVar14 = *(uint *)&pMVar3->field_0xc;
    lVar8 = (long)(int)uVar14;
    uVar15 = 0;
    do {
      if (0 < (int)uVar14) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar20 = **(long **)&pMVar3->field_0x48;
        lVar24 = lVar20 * uVar15 + *(long *)&pMVar3->field_0x10;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar21 = lVar24 - lVar20;
        lVar20 = lVar20 + lVar24;
        lVar5 = *(long *)&pMVar4->field_0x10;
        lVar6 = **(long **)&pMVar4->field_0x48;
        lVar1 = lVar5 + lVar6 * uVar15;
        lVar16 = lVar1 - lVar6;
        lVar17 = lVar1 + lVar6;
        lVar9 = lVar6 + lVar1 + -4;
        uVar12 = uVar15 | 1;
        uVar22 = 0xffffffff;
        uVar13 = 0;
        iVar23 = -1;
        do {
          switch(uVar22) {
          case 1:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001b1454:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                uVar11 = RemSP::length_ + 1;
                *(uint *)(lVar1 + uVar13 * 4) = RemSP::length_;
                RemSP::length_ = uVar11;
LAB_001b1478:
                iVar23 = 6;
              }
              else if (*(char *)(lVar21 + uVar13) == '\0') {
                if ((lVar8 <= (long)(uVar13 + 1)) || (*(char *)(lVar21 + uVar13 + 1) == '\0')) {
                  if ((uVar13 == 0) || (*(char *)((uVar13 - 1) + lVar21) == '\0'))
                  goto LAB_001b1454;
                  *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar16 + -4 + uVar13 * 4);
                  goto LAB_001b1478;
                }
                uVar11 = *(uint *)(lVar16 + 4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar11;
                iVar23 = 5;
                if ((uVar13 != 0) && (*(char *)((uVar13 - 1) + lVar21) != '\0')) {
                  RemSP::Merge(uVar11,*(uint *)(lVar16 + -4 + uVar13 * 4));
                }
              }
              else {
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar16 + uVar13 * 4);
                iVar23 = 4;
              }
              uVar22 = 2;
              goto LAB_001b1484;
            }
            uVar22 = 1;
            if ((uVar12 < uVar19) && (*(char *)(lVar20 + uVar13) != '\0')) {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar11 = RemSP::length_ + 1;
              *(uint *)(lVar17 + uVar13 * 4) = RemSP::length_;
              RemSP::length_ = uVar11;
              uVar22 = 3;
            }
            break;
          case 2:
            if (*(char *)(lVar24 + uVar13) == '\0') goto LAB_001b1135;
            uVar22 = 2;
LAB_001b10e3:
            if (iVar23 == 6) {
LAB_001b11a1:
              uVar11 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
              iVar23 = 6;
              if (uVar15 != 0) {
LAB_001b11b9:
                iVar23 = 6;
                if (((long)(uVar13 + 1) < lVar8) && (*(char *)(lVar21 + uVar13 + 1) != '\0'))
                goto LAB_001b12a3;
              }
            }
            else if (iVar23 == 5) {
LAB_001b1187:
              *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar1 + -4 + uVar13 * 4);
              iVar23 = 5;
              uVar22 = 5;
            }
            else if (iVar23 == 4) {
              uVar11 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
              goto joined_r0x001b0f06;
            }
LAB_001b1484:
            if ((uVar12 < uVar19) && (*(char *)(lVar20 + uVar13) != '\0')) {
              *(undefined4 *)(lVar17 + uVar13 * 4) = *(undefined4 *)(lVar1 + uVar13 * 4);
            }
            break;
          case 3:
          case 7:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001b116a:
                *(undefined4 *)(lVar1 + uVar13 * 4) = *(undefined4 *)(lVar9 + uVar13 * 4);
                iVar23 = 6;
              }
              else if (*(char *)(lVar21 + uVar13) == '\0') {
                if (((long)(uVar13 + 1) < lVar8) && (*(char *)(lVar21 + uVar13 + 1) != '\0')) {
LAB_001b13ea:
                  uVar11 = *(uint *)(lVar16 + 4 + uVar13 * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar11;
                  RemSP::Merge(uVar11,*(uint *)(lVar17 + (uVar13 - 1) * 4));
                  iVar23 = 5;
                  if ((uVar13 != 0) && (*(char *)(lVar21 + -1 + uVar13) != '\0')) {
                    RemSP::Merge(*(uint *)(lVar1 + uVar13 * 4),*(uint *)(lVar16 + -4 + uVar13 * 4));
                  }
                }
                else {
                  iVar23 = 6;
                  uVar11 = *(uint *)(lVar17 + (uVar13 - 1) * 4);
                  *(uint *)(lVar1 + uVar13 * 4) = uVar11;
                  if ((uVar13 != 0) && (*(char *)(lVar21 + -1 + uVar13) != '\0')) {
                    j = *(uint *)(lVar16 + -4 + uVar13 * 4);
LAB_001b14df:
                    iVar23 = 6;
                    RemSP::Merge(uVar11,j);
                  }
                }
              }
              else {
LAB_001b1061:
                uVar11 = *(uint *)(lVar16 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar11;
                RemSP::Merge(uVar11,*(uint *)(lVar9 + uVar13 * 4));
                iVar23 = 4;
              }
LAB_001b117c:
              uVar22 = 8;
              goto LAB_001b1484;
            }
            goto LAB_001b10a5;
          case 4:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              uVar22 = 4;
              if (iVar23 == 6) goto LAB_001b11a1;
              if (iVar23 == 5) goto LAB_001b1187;
              if (iVar23 != 4) goto LAB_001b1484;
              uVar11 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
joined_r0x001b0f06:
              iVar23 = 6;
              uVar22 = 4;
              if (uVar15 != 0) {
                uVar22 = 4;
                if (*(char *)(lVar21 + uVar13) == '\0') goto LAB_001b11b9;
                iVar23 = 4;
              }
              goto LAB_001b1484;
            }
            goto LAB_001b1135;
          case 5:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              uVar11 = *(uint *)(lVar1 + -4 + uVar13 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
              if (uVar15 == 0) {
LAB_001b126c:
                iVar23 = 6;
              }
              else {
                iVar23 = 4;
                if (*(char *)(lVar21 + uVar13) == '\0') {
                  if (lVar8 <= (long)(uVar13 + 1)) goto LAB_001b126c;
                  iVar23 = 6;
                  if (*(char *)(lVar21 + uVar13 + 1) != '\0') {
                    RemSP::Merge(uVar11,*(uint *)(lVar16 + 4 + uVar13 * 4));
                    iVar23 = 5;
                  }
                }
              }
              uVar22 = 4;
              goto LAB_001b1484;
            }
            goto LAB_001b1135;
          case 6:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              if (iVar23 == 6) {
                uVar11 = *(uint *)(lVar1 + -4 + uVar13 * 4);
                *(uint *)(lVar1 + uVar13 * 4) = uVar11;
                uVar22 = 6;
                if (((uVar15 == 0) || (lVar8 <= (long)(uVar13 + 1))) ||
                   (*(char *)(lVar21 + uVar13 + 1) == '\0')) {
                  iVar23 = 6;
                }
                else {
LAB_001b12a3:
                  RemSP::Merge(uVar11,*(uint *)(lVar16 + 4 + uVar13 * 4));
                  iVar23 = 5;
                }
              }
              else {
                uVar22 = 6;
                if (iVar23 == 5) goto LAB_001b1187;
              }
              goto LAB_001b1484;
            }
            goto LAB_001b1135;
          case 8:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              uVar22 = 8;
              goto LAB_001b10e3;
            }
LAB_001b1135:
            uVar22 = 1;
            if ((uVar12 < uVar19) && (*(char *)(lVar20 + uVar13) != '\0')) {
              *(undefined4 *)(lVar17 + uVar13 * 4) =
                   *(undefined4 *)(lVar5 + lVar6 * uVar15 + -4 + uVar13 * 4);
LAB_001b115f:
              uVar22 = 7;
            }
            break;
          case 9:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              if (uVar15 == 0) goto LAB_001b116a;
              if (*(char *)(lVar21 + uVar13) != '\0') goto LAB_001b1061;
              if (((long)(uVar13 + 1) < lVar8) && (*(char *)(lVar21 + uVar13 + 1) != '\0'))
              goto LAB_001b13ea;
              iVar23 = 6;
              lVar10 = uVar13 - 1;
              uVar11 = *(uint *)(lVar17 + lVar10 * 4);
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
              if ((uVar13 != 0) && (*(char *)(lVar21 + lVar10) != '\0')) {
                j = *(uint *)(lVar16 + lVar10 * 4);
                goto LAB_001b14df;
              }
              goto LAB_001b117c;
            }
LAB_001b10a5:
            uVar22 = 1;
            if ((uVar12 < uVar19) && (*(char *)(lVar20 + uVar13) != '\0')) {
              *(undefined4 *)(lVar17 + uVar13 * 4) = *(undefined4 *)(lVar17 + -4 + uVar13 * 4);
              uVar22 = 9;
            }
            break;
          case 0xffffffff:
            if (*(char *)(lVar24 + uVar13) != '\0') {
              if (uVar15 == 0) {
LAB_001b130a:
                RemSP::P_[RemSP::length_] = RemSP::length_;
                iVar23 = 6;
                uVar11 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
              }
              else if (*(char *)(lVar21 + uVar13) == '\0') {
                if ((lVar8 <= (long)(uVar13 + 1)) || (*(char *)(lVar21 + uVar13 + 1) == '\0'))
                goto LAB_001b130a;
                iVar23 = 5;
                uVar11 = *(uint *)(lVar16 + 4 + uVar13 * 4);
              }
              else {
                iVar23 = 4;
                uVar11 = *(uint *)(lVar16 + uVar13 * 4);
              }
              *(uint *)(lVar1 + uVar13 * 4) = uVar11;
              uVar22 = 2;
              if ((uVar12 < uVar19) && (*(char *)(lVar20 + uVar13) != '\0')) {
                *(uint *)(lVar17 + uVar13 * 4) = uVar11;
              }
              break;
            }
            uVar22 = 1;
            if ((uVar19 <= uVar12) || (*(char *)(lVar20 + uVar13) == '\0')) break;
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar11 = RemSP::length_ + 1;
            *(uint *)(lVar17 + uVar13 * 4) = RemSP::length_;
            RemSP::length_ = uVar11;
            goto LAB_001b115f;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar14);
      }
      puVar7 = RemSP::P_;
      uVar15 = uVar15 + 2;
    } while ((int)uVar15 < iVar18);
    if (RemSP::length_ < 2) {
      uVar14 = 1;
    }
    else {
      uVar14 = 1;
      uVar19 = 1;
      do {
        if (puVar7[uVar19] < uVar19) {
          uVar11 = puVar7[puVar7[uVar19]];
        }
        else {
          uVar11 = uVar14;
          uVar14 = uVar14 + 1;
        }
        puVar7[uVar19] = uVar11;
        uVar19 = uVar19 + 1;
      } while (uVar19 < RemSP::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar14;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar18 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar18) {
    lVar8 = *(long *)&pMVar4->field_0x10;
    lVar1 = **(long **)&pMVar4->field_0x48;
    lVar17 = 0;
    do {
      iVar23 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar23 != 0) {
        lVar20 = 0;
        do {
          *(uint *)(lVar8 + lVar20) = puVar7[*(uint *)(lVar8 + lVar20)];
          lVar20 = lVar20 + 4;
        } while ((long)iVar23 * 4 != lVar20);
        iVar18 = *(int *)&pMVar4->field_0x8;
      }
      lVar17 = lVar17 + 1;
      lVar8 = lVar8 + lVar1;
    } while (lVar17 < iVar18);
  }
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }